

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

_Bool av1_alloc_layer_context(AV1_COMP *cpi,int num_layers)

{
  void *memblk;
  void *pvVar1;
  int in_ESI;
  long in_RDI;
  SVC *svc;
  undefined4 in_stack_ffffffffffffffe8;
  
  memblk = (void *)(in_RDI + 0x9d330);
  if ((*(long *)(in_RDI + 0x9d488) == 0) || (*(int *)(in_RDI + 0x9d490) < in_ESI)) {
    aom_free(memblk);
    *(undefined4 *)((long)memblk + 0x160) = 0;
    pvVar1 = aom_calloc(CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(size_t)memblk);
    *(void **)((long)memblk + 0x158) = pvVar1;
    if (*(long *)((long)memblk + 0x158) == 0) {
      return false;
    }
    *(int *)((long)memblk + 0x160) = in_ESI;
  }
  return true;
}

Assistant:

bool av1_alloc_layer_context(AV1_COMP *cpi, int num_layers) {
  SVC *const svc = &cpi->svc;
  if (svc->layer_context == NULL || svc->num_allocated_layers < num_layers) {
    assert(num_layers > 1);
    aom_free(svc->layer_context);
    svc->num_allocated_layers = 0;
    svc->layer_context =
        (LAYER_CONTEXT *)aom_calloc(num_layers, sizeof(*svc->layer_context));
    if (svc->layer_context == NULL) return false;
    svc->num_allocated_layers = num_layers;
  }
  return true;
}